

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOGetScalarArray(FmsIOContext *ctx,char *path,FmsScalarType *type,void **values,FmsInt *n)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulonglong uVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  double dVar12;
  char *newoff;
  char v [512];
  char k [512];
  char *local_450;
  ulong local_448;
  ulong *local_440;
  char local_438 [512];
  char local_238 [520];
  
  if (ctx == (FmsIOContext *)0x0) {
    return 1;
  }
  if (path == (char *)0x0) {
    iVar3 = 2;
  }
  else if (type == (FmsScalarType *)0x0) {
    iVar3 = 3;
  }
  else if (values == (void **)0x0) {
    iVar3 = 4;
  }
  else if (n == (FmsInt *)0x0) {
    iVar3 = 5;
  }
  else {
    iVar2 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,local_238,local_438);
    iVar3 = 6;
    if (iVar2 == 0) {
      local_440 = n;
      pcVar4 = join_keys(path,"Size");
      iVar2 = strcmp(local_238,pcVar4);
      if (pcVar4 != (char *)0x0) {
        free(pcVar4);
      }
      puVar1 = local_440;
      iVar3 = 7;
      if (iVar2 == 0) {
        uVar5 = strtoull(local_438,(char **)0x0,10);
        *puVar1 = uVar5;
        piVar6 = __errno_location();
        if (*piVar6 == 0x22) {
          iVar3 = 8;
        }
        else if (*piVar6 == 0x16) {
          iVar3 = 9;
        }
        else {
          iVar2 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,local_238,local_438);
          iVar3 = 10;
          if (iVar2 == 0) {
            pcVar4 = join_keys(path,"Type");
            iVar2 = strcmp(local_238,pcVar4);
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            puVar1 = local_440;
            iVar3 = 0xb;
            if (iVar2 == 0) {
              iVar2 = FmsGetScalarTypeFromName(local_438,type);
              iVar3 = 0xc;
              if (iVar2 == 0) {
                if (*puVar1 != 0) {
                  iVar3 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,local_238,local_438);
                  if (iVar3 != 0) {
                    return 0xe;
                  }
                  pcVar4 = join_keys(path,"Values");
                  iVar3 = strcmp(local_238,pcVar4);
                  if (pcVar4 != (char *)0x0) {
                    free(pcVar4);
                  }
                  if (iVar3 != 0) {
                    return 0xf;
                  }
                  switch(*type) {
                  case FMS_FLOAT:
                    pvVar7 = malloc(*local_440 << 2);
                    local_448 = 0;
                    do {
                      uVar9 = local_448;
                      sVar8 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar10 = local_448;
                        if ((sVar8 == 0) || (uVar10 = uVar9, *local_440 <= uVar9)) break;
                        fVar11 = strtof(pcVar4,&local_450);
                        *(float *)((long)pvVar7 + uVar9 * 4) = fVar11;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar9 = uVar9 + 1;
                        uVar10 = uVar9;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar8);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar3 == 0));
                    break;
                  case FMS_DOUBLE:
                    pvVar7 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar9 = local_448;
                      sVar8 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar10 = local_448;
                        if ((sVar8 == 0) || (uVar10 = uVar9, *local_440 <= uVar9)) break;
                        dVar12 = strtod(pcVar4,&local_450);
                        *(double *)((long)pvVar7 + uVar9 * 8) = dVar12;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar9 = uVar9 + 1;
                        uVar10 = uVar9;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar8);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar3 == 0));
                    break;
                  case FMS_COMPLEX_FLOAT:
                    pvVar7 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar9 = local_448;
                      sVar8 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar10 = local_448;
                        if ((sVar8 == 0) || (uVar10 = uVar9, *local_440 * 2 <= uVar9)) break;
                        fVar11 = strtof(pcVar4,&local_450);
                        *(float *)((long)pvVar7 + uVar9 * 4) = fVar11;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar9 = uVar9 + 1;
                        uVar10 = uVar9;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar8);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar3 == 0));
                    break;
                  case FMS_COMPLEX_DOUBLE:
                    pvVar7 = malloc(*local_440 << 4);
                    local_448 = 0;
                    do {
                      uVar9 = local_448;
                      sVar8 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar10 = local_448;
                        if ((sVar8 == 0) || (uVar10 = uVar9, *local_440 * 2 <= uVar9)) break;
                        dVar12 = strtod(pcVar4,&local_450);
                        *(double *)((long)pvVar7 + uVar9 * 8) = dVar12;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar9 = uVar9 + 1;
                        uVar10 = uVar9;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar8);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar3 == 0));
                    break;
                  default:
                    return 0x10;
                  }
                  *values = pvVar7;
                }
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
FmsIOGetScalarArray(FmsIOContext *ctx, const char *path, FmsScalarType *type,
                    void **values, FmsInt *n) {
  int err = 0;
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!type) E_RETURN(3);
  if(!values) E_RETURN(4);
  if(!n) E_RETURN(5);

  /* Arrays are written like:
      path/Size: n
      path/Type: type
      path/Values: [1,2,3,
      4,5,6
      7,8,9]
  */

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(6);

    char *ksize = join_keys(path, "Size");
    err = strcmp(k, ksize);
    FREE(ksize);
    // Path & key didn't match
    if(err)
      E_RETURN(7);

    *n = StrToFmsInt(v, NULL, 10);

    if (errno == ERANGE) { E_RETURN(8); }
    if (errno == EINVAL) { E_RETURN(9); }
  }

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(10);

    char *ktype= join_keys(path, "Type");
    err = strcmp(k, ktype);
    FREE(ktype);
    // Path & key didn't match
    if(err)
      E_RETURN(11);

    if(FmsGetScalarTypeFromName(v, type))
      E_RETURN(12);
  }

  // Values does not get written if Size == 0
  if(*n == 0)
    return 0;

  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(14);

  char *kvalues = join_keys(path, "Values");
  err = strcmp(k, kvalues);
  FREE(kvalues);
  if(err)
    E_RETURN(15);

// Had to remake this for scalar because strto(f/d) doesn't take a base
#define READ_ARRAY_DATA(DEST_T, FUNC, SIZE) \
do { \
    DEST_T *data = malloc(sizeof(DEST_T) * SIZE); \
    FmsInt i = 0; \
    while(1) { \
        size_t len = strlen(v); \
        char *off = v, *newoff = NULL; \
        if(off[0] == '[') \
            off++; \
        while(len && i < SIZE) { \
            data[i++] = (DEST_T)FUNC(off, &newoff); \
            newoff++; \
            if(*newoff == ' ') newoff++; /* Current flaw in the file format, last element has no trialing space */ \
            if(newoff >= v + len) break; \
            off = newoff; \
        }